

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O3

int __thiscall
nsync::nsync_mu_semaphore_p_with_deadline(nsync *this,nsync_semaphore *s,nsync_time abs_deadline)

{
  int iVar1;
  nsync_semaphore *pnVar2;
  __time_t _Var3;
  int iVar4;
  long lVar5;
  int *piVar6;
  __time_t _Var7;
  nsync_semaphore **ppnVar8;
  nsync_time a;
  nsync_time a_00;
  nsync_time nVar9;
  nsync_semaphore *local_40;
  __time_t local_38;
  
  _Var7 = abs_deadline.tv_sec;
  do {
    while (iVar4 = *(int *)this, iVar4 == 0) {
      nVar9.tv_nsec = 999999999;
      nVar9.tv_sec = 0x7fffffffffffffff;
      a.tv_nsec = _Var7;
      a.tv_sec = (__time_t)s;
      iVar4 = nsync_time_cmp(a,nVar9);
      ppnVar8 = &local_40;
      pnVar2 = s;
      _Var3 = _Var7;
      if (iVar4 == 0) {
        ppnVar8 = (nsync_semaphore **)0x0;
        pnVar2 = local_40;
        _Var3 = local_38;
      }
      local_38 = _Var3;
      local_40 = pnVar2;
      lVar5 = syscall(0xca,this,0x189,0,ppnVar8,0,0xffffffff);
      if ((int)lVar5 != 0) {
        piVar6 = __errno_location();
        iVar4 = *piVar6;
        if (((iVar4 == 4) || (iVar4 == 0xb)) || (iVar4 == 0x6e)) {
          if (iVar4 == 0x6e && (int)lVar5 == -1) {
            nVar9 = nsync_time_now();
            a_00.tv_nsec = _Var7;
            a_00.tv_sec = (__time_t)s;
            iVar4 = nsync_time_cmp(a_00,nVar9);
            if (iVar4 < 1) {
              return 0x6e;
            }
          }
        }
        else {
          _DAT_00000000 = 0;
        }
      }
    }
    LOCK();
    iVar1 = *(int *)this;
    if (iVar4 == iVar1) {
      *(int *)this = iVar4 + -1;
    }
    UNLOCK();
  } while (iVar4 != iVar1);
  return 0;
}

Assistant:

int nsync_mu_semaphore_p_with_deadline (nsync_semaphore *s, nsync_time abs_deadline) {
	struct futex *f = (struct futex *)s;
	int i;
	int result = 0;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
			int futex_result;
			struct timespec ts_buf;
			const struct timespec *ts = NULL;
			if (nsync_time_cmp (abs_deadline, nsync_time_no_deadline) != 0) {
				memset (&ts_buf, 0, sizeof (ts_buf));
				if (FUTEX_TIMEOUT_IS_ABSOLUTE) {
					ts_buf.tv_sec = NSYNC_TIME_SEC (abs_deadline);
					ts_buf.tv_nsec = NSYNC_TIME_NSEC (abs_deadline);
				} else {
					nsync_time now;
					now = nsync_time_now ();
					if (nsync_time_cmp (now, abs_deadline) > 0) {
						ts_buf.tv_sec = 0;
						ts_buf.tv_nsec = 0;
					} else {
						nsync_time rel_deadline;
						rel_deadline = nsync_time_sub (abs_deadline, now);
						ts_buf.tv_sec = NSYNC_TIME_SEC (rel_deadline);
						ts_buf.tv_nsec = NSYNC_TIME_NSEC (rel_deadline);
					}
				}
				ts = &ts_buf;
			}
			futex_result = futex (&f->i, FUTEX_WAIT_, i, ts, NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR || errno == EWOULDBLOCK ||
				errno == ETIMEDOUT);
			/* Some systems don't wait as long as they are told. */ 
			if (futex_result == -1 && errno == ETIMEDOUT &&
			    nsync_time_cmp (abs_deadline, nsync_time_now ()) <= 0) {
				result = ETIMEDOUT;
			}
		}
	} while (result == 0 && (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i - 1)));
	return (result);
}